

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O1

string * __thiscall BMP::getUmCode_abi_cxx11_(string *__return_storage_ptr__,BMP *this,int a,int n)

{
  char cVar1;
  pointer pcVar2;
  size_type sVar3;
  char *pcVar4;
  pointer pcVar5;
  
  getBit_abi_cxx11_(__return_storage_ptr__,this,a);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar5 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  while (sVar3 = __return_storage_ptr__->_M_string_length, sVar3 != (long)n) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (sVar3 - 1);
  if (pcVar2 < pcVar5 && sVar3 != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BMP::getUmCode(int a, int n)
{
    using namespace std;

    string x = getBit( a );

    reverse( x.begin(), x.end() );

    while ( x.size() != n )
        x += '0';

    reverse( x.begin(), x.end() );

    return x;
}